

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

argument * parser(argument *__return_storage_ptr__,int argc,char **argv)

{
  char *pcVar1;
  size_t sVar2;
  
  __return_storage_ptr__->proxy_list = argv + 2;
  __return_storage_ptr__->proxy_count = argc + -3;
  pcVar1 = argv[1];
  sVar2 = strlen(pcVar1);
  (__return_storage_ptr__->download_address)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->download_address).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&__return_storage_ptr__->download_address,pcVar1,pcVar1 + sVar2);
  pcVar1 = argv[(long)argc + -1];
  sVar2 = strlen(pcVar1);
  (__return_storage_ptr__->file_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->file_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&__return_storage_ptr__->file_name,pcVar1,pcVar1 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

argument parser(int argc, char **argv) {
    argument argument = {
            argv + 2,
            argc - 3,
            string(argv[1], strlen(argv[1])),
            string(argv[argc - 1], strlen(argv[argc - 1]))

    };
    return argument;
}